

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.hpp
# Opt level: O1

void apply_blur(vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list,float blurness)

{
  pointer pMVar1;
  ostream *poVar2;
  Mat *img;
  pointer pMVar3;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined4 local_60 [2];
  pointer local_58;
  undefined8 uStack_50;
  undefined4 local_48 [2];
  pointer local_40;
  undefined8 local_38;
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,color::blue_abi_cxx11_,DAT_00159610);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Adjusting Blur : ",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,color::reset_abi_cxx11_,DAT_00159670);
  pMVar3 = (image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1 = (image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar3 != pMVar1) {
    do {
      local_38 = 0;
      local_48[0] = 0x1010000;
      uStack_50 = 0;
      local_60[0] = 0x2010000;
      local_68 = 0xffffffffffffffff;
      local_70 = (int)blurness;
      local_6c = (int)blurness;
      local_58 = pMVar3;
      local_40 = pMVar3;
      cv::blur(local_48,local_60,&local_70,&local_68,4);
      pMVar3 = pMVar3 + 0x60;
    } while (pMVar3 != pMVar1);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,color::green_abi_cxx11_,DAT_001595f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Done",4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,color::reset_abi_cxx11_,DAT_00159670);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void apply_blur(std::vector<cv::Mat> &image_list, float blurness) {
   std::cout << color::blue << "Adjusting Blur : " << color::reset;   
   for(auto &img: image_list) {
      blur(img, img, Size(blurness, blurness));
   }
   std::cout << color::green << "Done" <<color::reset<<std::endl;
}